

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-glyph.c
# Opt level: O0

_Bool borg_flow_glyph(int why)

{
  loc grid1;
  _Bool _Var1;
  wchar_t wVar2;
  uint uVar3;
  int iVar4;
  char *what;
  borg_grid *pbStack_1e8;
  borg_grid *ag_ptr_1 [24];
  int yy_1;
  int xx_1;
  int yy;
  int xx;
  int tmp_glyph;
  int floor;
  borg_grid *ag_ptr [24];
  borg_grid *ag;
  int glyph;
  int goal_glyph;
  int b_v;
  int b_y;
  int b_x;
  int v;
  int y;
  int x;
  int cost;
  int i;
  int why_local;
  
  b_v = borg.c.x;
  goal_glyph = borg.c.y;
  glyph = -1;
  ag._0_4_ = 0;
  if ((glyph_y_center != '\0') || (glyph_x_center != '\0')) {
    ag_ptr[0x17] = (borg_grid *)loc((uint)glyph_x_center,(uint)glyph_y_center);
    grid1.y = borg.c.y;
    grid1.x = borg.c.x;
    wVar2 = distance(grid1,(loc)ag_ptr[0x17]);
    if (wVar2 < L'2') goto LAB_00295df3;
  }
  borg_needs_new_sea = true;
LAB_00295df3:
  if (((uint)glyph_x == borg.c.x) && ((uint)glyph_y == borg.c.y)) {
    glyph_x = '\0';
    glyph_y = '\0';
    if ((borg_needs_new_sea & 1U) != 0) {
      glyph_y_center = (uint8_t)borg.c.y;
      glyph_x_center = (uint8_t)borg.c.x;
    }
    borg_needs_new_sea = false;
    what = format("# Glyph Creating at (%d,%d)",(ulong)(uint)borg.c.x,(ulong)(uint)borg.c.y);
    borg_note(what);
    _Var1 = borg_spell_fail(GLYPH_OF_WARDING,0x1e);
    if (((_Var1) || (_Var1 = borg_read_scroll(sv_scroll_rune_of_protection), _Var1)) ||
       (_Var1 = borg_activate_item(act_glyph), _Var1)) {
      for (x = 0; x < track_glyph.num; x = x + 1) {
        if ((track_glyph.x[x] == borg.c.x) && (track_glyph.y[x] == borg.c.y)) {
          return false;
        }
      }
      if (track_glyph.num < track_glyph.size) {
        borg_note("# Noting the creation of a glyph.");
        track_glyph.x[track_glyph.num] = borg.c.x;
        track_glyph.y[track_glyph.num] = borg.c.y;
        track_glyph.num = track_glyph.num + 1;
      }
      i._3_1_ = true;
    }
    else {
      i._3_1_ = false;
    }
  }
  else {
    borg_flow_reverse(L'ú',true,false,false,L'\xffffffff',false);
    for (b_x = 0xf; b_x < 0x33; b_x = b_x + 1) {
      for (v = 0x32; v < 0x94; v = v + 1) {
        xx = 0;
        yy = 0;
        if (((borg_grids[b_x][v].feat == '\x01') || ((borg_grids[b_x][v].glyph & 1U) == 0)) &&
           (uVar3 = (uint)borg_data_cost->data[b_x][v], uVar3 < 0x4b)) {
          for (x = 0; x < 0x18; x = x + 1) {
            *(borg_grid **)(&tmp_glyph + (long)x * 2) =
                 borg_grids[b_x + borg_ddy_ddd[x]] + (v + borg_ddx_ddd[x]);
          }
          if ((borg_needs_new_sea & 1U) == 0) {
            for (x = 0; x < 0x18; x = x + 1) {
              if (((((uint)glyph_x_center + (int)borg_ddx_ddd[x] == v) &&
                   ((uint)glyph_y_center + (int)borg_ddy_ddd[x] == b_x)) &&
                  (((borg_grids[b_x][v].glyph & 1U) == 0 && (iVar4 = 500 - uVar3, 0 < iVar4)))) &&
                 ((glyph < 0 || (glyph <= iVar4)))) {
                b_v = v;
                goal_glyph = b_x;
                glyph = iVar4;
              }
            }
          }
          else {
            for (x = 0; x < 0x18; x = x + 1) {
              if ((**(char **)(&tmp_glyph + (long)x * 2) == '\x01') ||
                 (((*(char **)(&tmp_glyph + (long)x * 2))[5] & 1U) != 0)) {
                xx = xx + 1;
              }
            }
            if (xx == 0x18) {
              for (x = 0; x < 0x18; x = x + 1) {
                if ((*(byte *)(*(long *)(&tmp_glyph + (long)x * 2) + 5) & 1) != 0) {
                  yy = yy + 1;
                }
              }
              b_y = (yy * 500 + 100) - uVar3;
              if (borg_grids[b_x][v].feat == '\x01') {
                b_y = b_y + 3000;
              }
              if (yy == 0x18) {
                b_y = b_y + 5000;
              }
              else if ((borg_grids[b_x][v].glyph & 1U) != 0) {
                b_y = -1;
              }
              if ((0 < b_y) && ((glyph < 0 || (glyph <= b_y)))) {
                glyph = b_y;
                b_v = v;
                goal_glyph = b_x;
              }
            }
          }
        }
      }
    }
    if ((glyph_y_center != '\0') && (glyph_x_center != '\0')) {
      for (x = 0; x < 0x18; x = x + 1) {
        ag_ptr_1[(long)x + -1] =
             borg_grids[(int)((uint)glyph_y_center + (int)borg_ddy_ddd[x])] +
             (int)((uint)glyph_x_center + (int)borg_ddx_ddd[x]);
        if ((ag_ptr_1[(long)x + -1]->glyph & 1U) != 0) {
          ag._0_4_ = (int)ag + 1;
        }
        if ((int)ag == 0x18) {
          glyph = 5000;
          b_v = (int)glyph_x_center;
          goal_glyph = (int)glyph_y_center;
        }
      }
    }
    borg_flow_clear();
    if (glyph < 0) {
      i._3_1_ = false;
    }
    else {
      glyph_x = (uint8_t)b_v;
      glyph_y = (uint8_t)goal_glyph;
      borg_flow_enqueue_grid(goal_glyph,b_v);
      borg_flow_spread(L'ú',true,false,false,L'\xffffffff',false);
      _Var1 = borg_flow_commit("Glyph",L'\x03');
      if (_Var1) {
        _Var1 = borg_flow_old(L'\x03');
        if (_Var1) {
          i._3_1_ = true;
        }
        else {
          i._3_1_ = false;
        }
      }
      else {
        i._3_1_ = false;
      }
    }
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_glyph(int why)
{
    int i;
    int cost;

    int x, y;
    int v          = 0;

    int b_x        = borg.c.x;
    int b_y        = borg.c.y;
    int b_v        = -1;
    int goal_glyph = 0;
    int glyph      = 0;

    borg_grid *ag;

    if ((glyph_y_center == 0 && glyph_x_center == 0)
        || distance(borg.c, loc(glyph_x_center, glyph_y_center)) >= 50) {
        borg_needs_new_sea = true;
    }

    /* We have arrived */
    if ((glyph_x == borg.c.x) && (glyph_y == borg.c.y)) {
        /* Cancel */
        glyph_x = 0;
        glyph_y = 0;

        /* Store the center of the glyphs */
        if (borg_needs_new_sea) {
            glyph_y_center = borg.c.y;
            glyph_x_center = borg.c.x;
        }

        borg_needs_new_sea = false;

        /* Take note */
        borg_note(format("# Glyph Creating at (%d,%d)", borg.c.x, borg.c.y));

        /* Create the Glyph */
        if (borg_spell_fail(GLYPH_OF_WARDING, 30)
            || borg_read_scroll(sv_scroll_rune_of_protection)
            || borg_activate_item(act_glyph)) {
            /* Check for an existing glyph */
            for (i = 0; i < track_glyph.num; i++) {
                /* Stop if we already new about this glyph */
                if ((track_glyph.x[i] == borg.c.x)
                    && (track_glyph.y[i] == borg.c.y))
                    return false;
            }

            /* Track the newly discovered glyph */
            if (track_glyph.num < track_glyph.size) {
                borg_note("# Noting the creation of a glyph.");
                track_glyph.x[track_glyph.num] = borg.c.x;
                track_glyph.y[track_glyph.num] = borg.c.y;
                track_glyph.num++;
            }

            /* Success */
            return true;
        }

        /* Nope */
        return false;
    }

    /* Reverse flow */
    borg_flow_reverse(250, true, false, false, -1, false);

    /* Scan the entire map */
    for (y = 15; y < AUTO_MAX_Y - 15; y++) {
        for (x = 50; x < AUTO_MAX_X - 50; x++) {
            borg_grid *ag_ptr[24];

            int floor     = 0;
            int tmp_glyph = 0;

            /* Acquire the grid */
            ag = &borg_grids[y][x];

            /* Skip every non floor/glyph */
            if (ag->feat != FEAT_FLOOR && ag->glyph)
                continue;

            /* Acquire the cost */
            cost = borg_data_cost->data[y][x];

            /* Skip grids that are really far away.  He probably
             * won't be able to safely get there
             */
            if (cost >= 75)
                continue;

            /* Extract adjacent locations to each considered grid */
            for (i = 0; i < 24; i++) {
                /* Extract the location */
                int xx = x + borg_ddx_ddd[i];
                int yy = y + borg_ddy_ddd[i];

                /* Get the grid contents */
                ag_ptr[i] = &borg_grids[yy][xx];
            }

            /* Center Grid */
            if (borg_needs_new_sea) {
                goal_glyph = 24;

                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];
                    if (ag->feat == FEAT_FLOOR || ag->glyph)
                        floor++;
                }

                /* Not a good location if not the center of the sea */
                if (floor != 24) {
                    continue;
                }

                /* Count floors already glyphed */
                for (i = 0; i < 24; i++) {
                    ag = ag_ptr[i];

                    /* Glyphs */
                    if (ag->glyph) {
                        tmp_glyph++;
                    }
                }

                /* Tweak -- Reward certain floors, punish distance */
                v = 100 + (tmp_glyph * 500) - (cost * 1);
                if (borg_grids[y][x].feat == FEAT_FLOOR)
                    v += 3000;

                /* If this grid is surrounded by glyphs, select it */
                if (tmp_glyph == goal_glyph)
                    v += 5000;

                /* If this grid is already glyphed but not
                 * surrounded by glyphs, then choose another.
                 */
                if (tmp_glyph != goal_glyph && borg_grids[y][x].glyph)
                    v = -1;

                /* The grid is not searchable */
                if (v <= 0)
                    continue;

                /* Track "best" grid */
                if ((b_v >= 0) && (v < b_v))
                    continue;

                /* Save the data */
                b_v = v;
                b_x = x;
                b_y = y;
            }
            /* old center, making outlying glyphs, */
            else {
                /* Count Adjacent Flooors */
                for (i = 0; i < 24; i++) {
                    /* Leave if this grid is not in good array */
                    if (glyph_x_center + borg_ddx_ddd[i] != x)
                        continue;
                    if (glyph_y_center + borg_ddy_ddd[i] != y)
                        continue;

                    /* Already got a glyph on it */
                    if (borg_grids[y][x].glyph)
                        continue;

                    /* Tweak -- Reward certain floors, punish distance */
                    v = 500 + (tmp_glyph * 500) - (cost * 1);

                    /* The grid is not searchable */
                    if (v <= 0)
                        continue;

                    /* Track "best" grid */
                    if ((b_v >= 0) && (v < b_v))
                        continue;

                    /* Save the data */
                    b_v = v;
                    b_x = x;
                    b_y = y;
                }
            }
        }
    }

    /* Extract adjacent locations to each considered grid */
    if (glyph_y_center != 0 && glyph_x_center != 0) {

        for (i = 0; i < 24; i++) {
            /* Extract the location */
            int xx = glyph_x_center + borg_ddx_ddd[i];
            int yy = glyph_y_center + borg_ddy_ddd[i];

            borg_grid *ag_ptr[24];

            /* Get the grid contents */
            ag_ptr[i] = &borg_grids[yy][xx];
            ag        = ag_ptr[i];

            /* If it is not a glyph, skip it */
            if (ag->glyph)
                glyph++;

            /* Save the data */
            if (glyph == 24) {
                b_v = 5000;
                b_x = glyph_x_center;
                b_y = glyph_y_center;
            }
        }
    }

    /* Clear the flow codes */
    borg_flow_clear();

    /* Hack -- Nothing found */
    if (b_v < 0)
        return false;

    /* Access grid */
    ag = &borg_grids[b_y][b_x];

    /* Memorize */
    glyph_x = b_x;
    glyph_y = b_y;

    /* Enqueue the grid */
    borg_flow_enqueue_grid(b_y, b_x);

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("Glyph", GOAL_MISC))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_MISC))
        return false;

    /* Success */
    return true;
}